

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O0

UVec3 __thiscall
vkt::sparse::anon_unknown_0::computeWorkGroupSize(anon_unknown_0 *this,deUint32 numInvocations)

{
  uint *puVar1;
  uint extraout_EDX;
  UVec3 UVar2;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  deUint32 zWorkGroupSize;
  uint local_34;
  uint local_30;
  deUint32 yWorkGroupSize;
  uint local_28;
  deUint32 xWorkGroupSize;
  deUint32 numInvocationsLeft;
  UVec3 maxComputeWorkGroupSize;
  deUint32 maxComputeWorkGroupInvocations;
  deUint32 numInvocations_local;
  
  maxComputeWorkGroupSize.m_data[1] = 0x80;
  maxComputeWorkGroupSize.m_data[2] = numInvocations;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)&xWorkGroupSize,0x80,0x80,0x40);
  local_28 = maxComputeWorkGroupSize.m_data[2];
  local_30 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&xWorkGroupSize);
  puVar1 = std::min<unsigned_int>(&local_28,&local_30);
  puVar1 = std::min<unsigned_int>(puVar1,maxComputeWorkGroupSize.m_data + 1);
  yWorkGroupSize = *puVar1;
  local_28 = local_28 / yWorkGroupSize + (uint)(local_28 % yWorkGroupSize != 0);
  zWorkGroupSize = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&xWorkGroupSize);
  puVar1 = std::min<unsigned_int>(&local_28,&zWorkGroupSize);
  local_3c = (uint)(0x80 / (ulong)yWorkGroupSize);
  puVar1 = std::min<unsigned_int>(puVar1,&local_3c);
  local_34 = *puVar1;
  local_28 = local_28 / local_34 + (uint)(local_28 % local_34 != 0);
  local_44 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)&xWorkGroupSize);
  puVar1 = std::min<unsigned_int>(&local_28,&local_44);
  local_48 = 0x80 / (yWorkGroupSize * local_34);
  puVar1 = std::min<unsigned_int>(puVar1,&local_48);
  local_40 = *puVar1;
  local_28 = local_28 / local_40 + (uint)(local_28 % local_40 != 0);
  tcu::Vector<unsigned_int,_3>::Vector
            ((Vector<unsigned_int,_3> *)this,yWorkGroupSize,local_34,local_40);
  UVar2.m_data[2] = extraout_EDX;
  UVar2.m_data._0_8_ = this;
  return (UVec3)UVar2.m_data;
}

Assistant:

tcu::UVec3 computeWorkGroupSize (const deUint32 numInvocations)
{
	const deUint32		maxComputeWorkGroupInvocations	= 128u;
	const tcu::UVec3	maxComputeWorkGroupSize			= tcu::UVec3(128u, 128u, 64u);
	deUint32			numInvocationsLeft				= numInvocations;

	const deUint32 xWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.x()), maxComputeWorkGroupInvocations);
	numInvocationsLeft = numInvocationsLeft / xWorkGroupSize + ((numInvocationsLeft % xWorkGroupSize) ? 1u : 0u);

	const deUint32 yWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.y()), maxComputeWorkGroupInvocations / xWorkGroupSize);
	numInvocationsLeft = numInvocationsLeft / yWorkGroupSize + ((numInvocationsLeft % yWorkGroupSize) ? 1u : 0u);

	const deUint32 zWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.z()), maxComputeWorkGroupInvocations / (xWorkGroupSize*yWorkGroupSize));
	numInvocationsLeft = numInvocationsLeft / zWorkGroupSize + ((numInvocationsLeft % zWorkGroupSize) ? 1u : 0u);

	return tcu::UVec3(xWorkGroupSize, yWorkGroupSize, zWorkGroupSize);
}